

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void despot::DESPOT::Update(VNode *vnode)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar4;
  double *pdVar5;
  double dVar6;
  ValuedAction VVar7;
  double local_68;
  double local_60;
  QNode *local_58;
  QNode *qnode;
  double dStack_48;
  ACT_TYPE action;
  double utility_upper;
  double local_38;
  double local_30;
  double upper;
  double local_20;
  double local_18;
  double lower;
  VNode *vnode_local;
  
  lower = (double)vnode;
  bVar2 = VNode::IsLeaf(vnode);
  if (!bVar2) {
    VVar7 = VNode::default_move((VNode *)lower);
    local_20 = VVar7.value;
    upper._0_4_ = VVar7.action;
    local_18 = local_20;
    VVar7 = VNode::default_move((VNode *)lower);
    local_38 = VVar7.value;
    utility_upper._0_4_ = VVar7.action;
    dStack_48 = -INFINITY;
    qnode._4_4_ = 0;
    local_30 = local_38;
    while( true ) {
      uVar3 = (ulong)qnode._4_4_;
      this = VNode::children((VNode *)lower);
      sVar4 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
      dVar1 = local_18;
      if (sVar4 <= uVar3) break;
      local_58 = VNode::Child((VNode *)lower,qnode._4_4_);
      local_60 = QNode::lower_bound(local_58);
      pdVar5 = std::max<double>(&local_18,&local_60);
      local_18 = *pdVar5;
      local_68 = QNode::upper_bound(local_58);
      pdVar5 = std::max<double>(&local_30,&local_68);
      local_30 = *pdVar5;
      pdVar5 = std::max<double>(&stack0xffffffffffffffb8,&local_58->utility_upper_bound);
      dStack_48 = *pdVar5;
      qnode._4_4_ = qnode._4_4_ + 1;
    }
    dVar6 = VNode::lower_bound((VNode *)lower);
    if (dVar6 < dVar1) {
      VNode::lower_bound((VNode *)lower,local_18);
    }
    dVar1 = local_30;
    dVar6 = VNode::upper_bound((VNode *)lower);
    if (dVar1 < dVar6) {
      VNode::upper_bound((VNode *)lower,local_30);
    }
    if (dStack_48 < *(double *)((long)lower + 0x90)) {
      *(double *)((long)lower + 0x90) = dStack_48;
    }
  }
  return;
}

Assistant:

void DESPOT::Update(VNode* vnode) {
	if (vnode->IsLeaf()) {
		return;
	}

	double lower = vnode->default_move().value;
	double upper = vnode->default_move().value;
	double utility_upper = Globals::NEG_INFTY;

	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		lower = max(lower, qnode->lower_bound());
		upper = max(upper, qnode->upper_bound());
		utility_upper = max(utility_upper, qnode->utility_upper_bound);
	}

	if (lower > vnode->lower_bound()) {
		vnode->lower_bound(lower);
	}
	if (upper < vnode->upper_bound()) {
		vnode->upper_bound(upper);
	}
	if (utility_upper < vnode->utility_upper_bound) {
		vnode->utility_upper_bound = utility_upper;
	}
}